

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_ExpressionMacro_x_iutest_x_False_Test::Body(iu_ExpressionMacro_x_iutest_x_False_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  char *in_R9;
  ScopedSPITestFlag guard_1;
  AssertionResult local_350;
  iuCodeMessage local_328;
  int local_2f8 [4];
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_ar;
  AssertionResult iutest_spi_ar;
  undefined1 local_260 [40];
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar_1;
  undefined1 local_1e8 [40];
  ExpressionResult local_1c0;
  Fixed local_198;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1c0.m_result.m_message._M_dataplus._M_p._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_260,(int *)&local_1c0);
  local_1e8._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_350,(ExpressionLHS<int> *)local_260,(int *)local_1e8);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_328,(ExpressionResult *)&local_350);
  iutest::AssertionResult::operator!((AssertionResult *)&local_198,(AssertionResult *)&local_328);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)(local_260 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_350.m_message,(internal *)&iutest_ar,(AssertionResult *)0x14052f,"true",
               "false",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_328,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xf3,local_350.m_message._M_dataplus._M_p);
    local_328._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_328,&local_198);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_350);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"42 == 42",(allocator<char> *)&local_328);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xf3,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_1);
  local_2f8[3] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)&iutest_spi_ar,local_2f8 + 3);
  local_2f8[2] = 0x29;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)local_260,(ExpressionLHS<int> *)&iutest_spi_ar,local_2f8 + 2);
  iutest::detail::ExpressionResult::GetResult(&local_350,(ExpressionResult *)local_260);
  local_2f8[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1e8,local_2f8 + 1);
  local_2f8[0] = 10;
  iutest::detail::ExpressionLHS<int>::operator!=
            (&local_1c0,(ExpressionLHS<int> *)local_1e8,local_2f8);
  iutest::detail::ExpressionResult::GetResult((AssertionResult *)&guard,&local_1c0);
  iutest::AssertionResult::operator&&
            ((AssertionResult *)&local_328,&local_350,(AssertionResult *)&guard);
  iutest::AssertionResult::operator!((AssertionResult *)&local_198,(AssertionResult *)&local_328);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&guard);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)&iutest_spi_ar.m_message._M_string_length);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_350.m_message,(internal *)&iutest_ar,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 41) && IUTEST_EXPRESSION(f() != 10)",
               "true","false",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_328,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xf4,local_350.m_message._M_dataplus._M_p);
    local_328._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_328,&local_198);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_350);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard_1;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"42 != 41 && 42 != 10",(allocator<char> *)&local_328);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar_1,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar_1.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xf4,iutest_spi_ar_1.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar_1);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_1);
  local_2f8[3] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)&iutest_spi_ar,local_2f8 + 3);
  local_2f8[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)local_260,(ExpressionLHS<int> *)&iutest_spi_ar,local_2f8 + 2);
  iutest::detail::ExpressionResult::GetResult(&local_350,(ExpressionResult *)local_260);
  local_2f8[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1e8,local_2f8 + 1);
  local_2f8[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==
            (&local_1c0,(ExpressionLHS<int> *)local_1e8,local_2f8);
  iutest::detail::ExpressionResult::GetResult((AssertionResult *)&guard,&local_1c0);
  iutest::AssertionResult::operator||
            ((AssertionResult *)&local_328,&local_350,(AssertionResult *)&guard);
  iutest::AssertionResult::operator!((AssertionResult *)&local_198,(AssertionResult *)&local_328);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&guard);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)&iutest_spi_ar.m_message._M_string_length);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_350.m_message,(internal *)&iutest_ar,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 42) || IUTEST_EXPRESSION(f() == 42)",
               "true","false",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_328,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xf5,local_350.m_message._M_dataplus._M_p);
    local_328._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_328,&local_198);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_350);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard_1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"42 != 42 || 42 == 42",(allocator<char> *)&local_328);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar_1,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar_1.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xf5,iutest_spi_ar_1.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar_1);
  return;
}

Assistant:

IUTEST(ExpressionMacro, False)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_FALSE(IUTEST_EXPRESSION(f() == 42)), "42 == 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_FALSE(IUTEST_EXPRESSION(f() != 41) && IUTEST_EXPRESSION(f() != 10)), "42 != 41 && 42 != 10");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_FALSE(IUTEST_EXPRESSION(f() != 42) || IUTEST_EXPRESSION(f() == 42)), "42 != 42 || 42 == 42");
}